

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O2

RC __thiscall
QL_Manager::JoinRelationWithQO
          (QL_Manager *this,QL_Node **topNode,QO_Rel *qorels,QL_Node *currNode,int qoIdx)

{
  char **ppcVar1;
  int relIndex;
  int iVar2;
  uint subNodeAttr;
  uint indexNumber;
  RelCatEntry *pRVar3;
  Condition *pCVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Condition condition;
  Condition *pCVar7;
  QL_Node **ppQVar8;
  QL_NodeRel *node2;
  int i;
  RC RVar9;
  int *attrs;
  long lVar10;
  mapped_type *pmVar11;
  QL_NodeJoin *this_00;
  int iVar12;
  int *piVar13;
  RelAttr attr;
  int index1;
  int index2;
  int numConds;
  QL_Node **local_70;
  QL_NodeRel *local_68;
  QO_Rel *local_60;
  QL_Node *local_58;
  string relString;
  
  relIndex = qorels[qoIdx].relIdx;
  local_70 = topNode;
  local_58 = currNode;
  local_68 = (QL_NodeRel *)operator_new(0x120);
  QL_NodeRel::QL_NodeRel(local_68,this,this->relEntries + relIndex);
  local_60 = qorels + qoIdx;
  pRVar3 = this->relEntries;
  piVar13 = &pRVar3[relIndex].attrCount;
  attrs = (int *)malloc((long)*piVar13 << 2);
  attrs[0] = 0;
  attrs[1] = 0;
  for (lVar10 = 0; lVar10 < *piVar13; lVar10 = lVar10 + 1) {
    attrs[lVar10] = 0;
  }
  std::__cxx11::string::string((string *)&relString,pRVar3[relIndex].relName,(allocator *)&numConds)
  ;
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::operator[](&this->relToAttrIndex,&relString);
  node2 = local_68;
  iVar2 = *pmVar11;
  pRVar3 = this->relEntries;
  for (lVar10 = 0; iVar12 = pRVar3[relIndex].attrCount, lVar10 < iVar12; lVar10 = lVar10 + 1) {
    attrs[lVar10] = iVar2 + (int)lVar10;
  }
  QL_NodeRel::SetUpNode(local_68,attrs,iVar12);
  free(attrs);
  CountNumConditions(this,relIndex,&numConds);
  this_00 = (QL_NodeJoin *)operator_new(0x70);
  QL_NodeJoin::QL_NodeJoin(this_00,this,local_58,&node2->super_QL_Node);
  RVar9 = QL_NodeJoin::SetUpNode(this_00,numConds);
  if (RVar9 == 0) {
    *local_70 = (QL_Node *)this_00;
    subNodeAttr = local_60->indexAttr;
    if ((long)(int)subNodeAttr != -1) {
      iVar2 = local_60->indexCond;
      index1 = 0;
      index2 = 0;
      attr.attrName = this->condptr[iVar2].lhsAttr.attrName;
      attr.relName = this->condptr[iVar2].lhsAttr.relName;
      GetAttrCatEntryPos(this,attr,&index1);
      if (this->condptr[iVar2].bRhsIsAttr == 0) {
        iVar12 = 0;
      }
      else {
        GetAttrCatEntryPos(this,this->condptr[iVar2].rhsAttr,&index2);
        iVar12 = index2;
      }
      if (index1 != subNodeAttr) {
        iVar12 = index1;
      }
      indexNumber = this->attrEntries[(int)subNodeAttr].indexNo;
      if (indexNumber != 0xffffffff) {
        if (this->condptr[iVar2].bRhsIsAttr == 0) {
          RVar9 = (*(node2->super_QL_Node)._vptr_QL_Node[8])
                            (node2,(ulong)subNodeAttr,(ulong)indexNumber,
                             this->condptr[iVar2].rhsValue.data);
        }
        else {
          RVar9 = QL_NodeJoin::UseIndexJoin(this_00,iVar12,subNodeAttr,indexNumber);
        }
        if (RVar9 != 0) goto LAB_0010d27b;
      }
    }
    ppQVar8 = local_70;
    for (index1 = 0; RVar9 = 0, index1 < this->nConds; index1 = index1 + 1) {
      pmVar11 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](&this->conditionToRel,&index1);
      if (*pmVar11 == relIndex) {
        pCVar4 = this->condptr;
        lVar10 = (long)index1;
        pCVar7 = pCVar4 + lVar10;
        uVar5 = pCVar7->op;
        uVar6 = pCVar7->bRhsIsAttr;
        condition.bRhsIsAttr = uVar6;
        condition.op = uVar5;
        ppcVar1 = &pCVar4[lVar10].rhsAttr.attrName;
        condition.lhsAttr = pCVar4[lVar10].lhsAttr;
        condition.rhsAttr.relName = ((RelAttr *)(&pCVar7->op + 2))->relName;
        condition.rhsAttr.attrName = *ppcVar1;
        condition.rhsValue._0_8_ = ppcVar1[1];
        condition.rhsValue.data = pCVar4[lVar10].rhsValue.data;
        RVar9 = QL_Node::AddCondition(*ppQVar8,condition,index1);
        if (RVar9 != 0) break;
      }
    }
  }
LAB_0010d27b:
  std::__cxx11::string::~string((string *)&relString);
  return RVar9;
}

Assistant:

RC QL_Manager::JoinRelationWithQO(QL_Node *&topNode, QO_Rel* qorels, QL_Node *currNode, int qoIdx){
  RC rc = 0;
  int relIndex = qorels[qoIdx].relIdx;
  // create new relation node, providing the relation entry
  QL_NodeRel *relNode = new QL_NodeRel(*this, relEntries + relIndex);

  // Set up the list of indices corresponding to attributes in the relation
  int *attrList = (int *)malloc(relEntries[relIndex].attrCount * sizeof(int));
  memset((void *)attrList, 0, sizeof(attrList));
  for(int i = 0;  i < relEntries[relIndex].attrCount ; i++){
    attrList[i] = 0;
  }
  string relString(relEntries[relIndex].relName);
  int start = relToAttrIndex[relString]; // get the offset of the first attr in this relation
  for(int i = 0;  i < relEntries[relIndex].attrCount ; i++){
    attrList[i] = start + i;
  }
  // Set up the relation node by providing the attribute list and # of attributes
  relNode->SetUpNode(attrList, relEntries[relIndex].attrCount);
  free(attrList);

  // Count the # of conditions associated with this attribute
  int numConds;
  CountNumConditions(relIndex, numConds);

  // create new join node:
  QL_NodeJoin *joinNode = new QL_NodeJoin(*this, *currNode, *relNode);
  if((rc = joinNode->SetUpNode(numConds))) // provide a max count on # of conditions
    return (rc);                           // to add to this join
  topNode = joinNode;

  if(qorels[qoIdx].indexAttr != -1){
    int condIdx = qorels[qoIdx].indexCond;
    int index = qorels[qoIdx].indexAttr;
    int index1 = 0;
    int index2 = 0;
    GetAttrCatEntryPos(condptr[condIdx].lhsAttr, index1);
    if(condptr[condIdx].bRhsIsAttr)
      GetAttrCatEntryPos(condptr[condIdx].rhsAttr, index2);
    int otherAttr;
    if(index1 == index)
      otherAttr = index2;
    else
      otherAttr = index1;
    if((attrEntries[index].indexNo != -1) && !condptr[condIdx].bRhsIsAttr){ // add only if there is an index on this attribute
      //cout << "adding index join on attr " << index; 
      if((rc = relNode->UseIndex(index, attrEntries[index].indexNo, condptr[condIdx].rhsValue.data) ))
        return (rc);
    }
    else if((attrEntries[index].indexNo != -1) && condptr[condIdx].bRhsIsAttr){
      //cout << "adding, lhs attr: " << otherAttr << ", rhsATtr: " << index << endl;
      if((rc = joinNode->UseIndexJoin(otherAttr, index, attrEntries[index].indexNo)))
        return (rc);
    }
  }
  for(int i = 0 ; i < nConds; i++){
    if(conditionToRel[i] == relIndex){
      if((rc = topNode->AddCondition(condptr[i], i) ))
        return (rc);
    }
  }
  return (0);
}